

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parser::try_match_blocked(parser *this,parser *parse,arg_string *arg)

{
  bool bVar1;
  size_type sVar2;
  reference __x;
  reference pvVar3;
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_48;
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_40;
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  local_38;
  __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
  i;
  int nold;
  arg_string *arg_local;
  parser *parse_local;
  parser *this_local;
  
  sVar2 = std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::size
                    (&parse->args_);
  i._M_current._4_4_ = (int)sVar2;
  detail::scoped_dfs_traverser::ignore_blocking(&parse->pos_,true);
  bVar1 = try_match(parse,arg);
  if (bVar1) {
    local_40._M_current =
         (arg_mapping *)
         std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::begin
                   (&parse->args_);
    local_38 = __gnu_cxx::
               __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
               ::operator+(&local_40,(long)i._M_current._4_4_);
    while( true ) {
      local_48._M_current =
           (arg_mapping *)
           std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::end
                     (&parse->args_);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
            ::operator*(&local_38);
      std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::
      push_back(&this->args_,__x);
      pvVar3 = std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
               ::back(&this->args_);
      pvVar3->blocked_ = true;
      __gnu_cxx::
      __normal_iterator<clipp::parser::arg_mapping_*,_std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>_>
      ::operator++(&local_38);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool try_match_blocked(parser&& parse, const arg_string& arg)
    {
        const auto nold = int(parse.args_.size());

        parse.pos_.ignore_blocking(true);

        if(!parse.try_match(arg)) return false;

        for(auto i = parse.args_.begin() + nold; i != parse.args_.end(); ++i) {
            args_.push_back(*i);
            args_.back().blocked_ = true;
        }
        return true;
    }